

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O3

void __thiscall
ConfidentialNonce_Constractor_bytedata0_Test::TestBody
          (ConfidentialNonce_Constractor_bytedata0_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  ConfidentialNonce nonce;
  ByteData bytedata;
  AssertHelper local_88;
  Message local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Message local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [20];
  int local_4c;
  ConfidentialNonce local_48;
  ByteData local_20;
  
  cfd::core::ByteData::ByteData(&local_20);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_48,&local_20);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_80,"nonce.GetHex().c_str()","\"\"",
             (char *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_),"");
  if ((undefined1 *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != local_60) {
    operator_delete((undefined1 *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_));
  }
  if (local_80.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::GetData();
  local_88.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize();
  local_4c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_80,"nonce.GetData().GetDataSize()","0",(unsigned_long *)&local_88,
             &local_4c);
  if ((void *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_));
  }
  if (local_80.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.ss_.ptr_._0_1_ = (internal)cfd::core::ConfidentialNonce::HasBlinding();
  local_88.data_ = local_88.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"nonce.HasBlinding()","false",(bool *)&local_80,(bool *)&local_88
            );
  if (local_70.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_80);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_80.ss_.ptr_._1_7_,local_80.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_80.ss_.ptr_._1_7_,local_80.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_80.ss_.ptr_._1_7_,local_80.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_004e1260;
  if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_bytedata0) {
  // 0byte
  ByteData bytedata;
  ConfidentialNonce nonce(bytedata);
  EXPECT_STREQ(nonce.GetHex().c_str(), "");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 0);
  EXPECT_EQ(nonce.HasBlinding(), false);
}